

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::Mesh::Mesh(Mesh *this)

{
  this->hasSkeletalAnimations = false;
  (this->skeletonRef)._M_dataplus._M_p = (pointer)&(this->skeletonRef).field_2;
  (this->skeletonRef)._M_string_length = 0;
  (this->skeletonRef).field_2._M_local_buf[0] = '\0';
  this->skeleton = (Skeleton *)0x0;
  this->sharedVertexData = (VertexData *)0x0;
  (this->subMeshes).
  super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subMeshes).
  super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subMeshes).
  super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->animations).
  super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animations).
  super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animations).
  super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poses).super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poses).super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poses).super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Mesh::Mesh() 
    : hasSkeletalAnimations(false)
    , skeleton(NULL)
    , sharedVertexData(NULL)
    , subMeshes()
    , animations()
    , poses()
{
}